

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::discardSurplusFateCards(Player *this)

{
  Deck *this_00;
  int iVar1;
  size_t sVar2;
  Card *pCVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  _List_base<Card_*,_std::allocator<Card_*>_> local_48;
  
  this_00 = &this->hand;
  iVar4 = 0;
  while( true ) {
    Deck::getDeck_abi_cxx11_((list<Card_*,_std::allocator<Card_*>_> *)&local_48,this_00);
    sVar2 = local_48._M_impl._M_node._M_size;
    iVar1 = this->maxHand;
    std::__cxx11::_List_base<Card_*,_std::allocator<Card_*>_>::_M_clear(&local_48);
    if (sVar2 <= (ulong)(long)iVar1) break;
    Deck::getDeck_abi_cxx11_((list<Card_*,_std::allocator<Card_*>_> *)&local_48,this_00);
    pCVar3 = Deck::popCard(this_00,(Card *)local_48._M_impl._M_node.super__List_node_base._M_next[1]
                                           ._M_next);
    if (pCVar3 != (Card *)0x0) {
      (*pCVar3->_vptr_Card[3])(pCVar3);
    }
    std::__cxx11::_List_base<Card_*,_std::allocator<Card_*>_>::_M_clear(&local_48);
    iVar4 = iVar4 + 1;
  }
  poVar6 = (ostream *)&std::cout;
  if (iVar4 == 0) {
    pcVar5 = "Didn\'t discard any cards";
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"Discarded ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
    pcVar5 = " cards";
  }
  poVar6 = std::operator<<(poVar6,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

void Player::discardSurplusFateCards()                                         //discards cards from player's hand until it is within its limits
{
    int count = 0;

    while (hand.getDeck().size() > maxHand)
    {
        delete hand.popCard(*hand.getDeck().begin());
        count++;
    }

    if (count)
        cout << "Discarded "<<count<<" cards"<<endl;
    else
        cout << "Didn't discard any cards"<<endl;
}